

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFFormFieldObjectHelper::generateAppearance
          (QPDFFormFieldObjectHelper *this,QPDFAnnotationObjectHelper *aoh)

{
  bool bVar1;
  undefined1 local_38 [8];
  string ft;
  QPDFAnnotationObjectHelper *aoh_local;
  QPDFFormFieldObjectHelper *this_local;
  
  ft.field_2._8_8_ = aoh;
  getFieldType_abi_cxx11_((string *)local_38,this);
  bVar1 = std::operator==((string *)local_38,"/Tx");
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"/Ch"), bVar1)) {
    generateTextAppearance(this,(QPDFAnnotationObjectHelper *)ft.field_2._8_8_);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::generateAppearance(QPDFAnnotationObjectHelper& aoh)
{
    std::string ft = getFieldType();
    // Ignore field types we don't know how to generate appearances for. Button fields don't really
    // need them -- see code in QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded.
    if ((ft == "/Tx") || (ft == "/Ch")) {
        generateTextAppearance(aoh);
    }
}